

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O0

clock_t Integer::times(tms *__buffer)

{
  Integer *this;
  size_type sVar1;
  reference ppDVar2;
  long local_50;
  int local_30;
  int i;
  long local_20;
  Integer *local_18;
  Integer *result;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  result = (Integer *)__buffer;
  this = (Integer *)operator_new(0x18);
  local_20 = 1;
  Integer(this,&local_20);
  local_30 = 0;
  local_18 = this;
  while( true ) {
    sVar1 = std::vector<Data_*,_std::allocator<Data_*>_>::size
                      ((vector<Data_*,_std::allocator<Data_*>_> *)result);
    if (sVar1 <= (ulong)(long)local_30) break;
    ppDVar2 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[]
                        ((vector<Data_*,_std::allocator<Data_*>_> *)result,(long)local_30);
    if (*ppDVar2 == (value_type)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = __dynamic_cast(*ppDVar2,&Data::typeinfo,&typeinfo,0);
    }
    local_18->value = *(long *)(local_50 + 0x10) * local_18->value;
    local_30 = local_30 + 1;
  }
  return (clock_t)local_18;
}

Assistant:

Data *Integer::times(std::vector<Data *> *dataPara) {
    auto result = new Integer(1);
    for (int i = 0; i < dataPara->size(); i++) {
        result->value *= (dynamic_cast<Integer *>((*dataPara)[i]))->value;
    }
    return result;
}